

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O1

set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> * __thiscall
spvtools::val::ValidationState_t::EntryPointReferences
          (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
           *__return_storage_ptr__,ValidationState_t *this,uint32_t id)

{
  _Rb_tree_header *__position;
  pointer ppVar1;
  pointer puVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  Instruction *pIVar3;
  pointer ppVar4;
  vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
  stack;
  vector<unsigned_int,_std::allocator<unsigned_int>_> function_entry_points;
  Instruction *inst;
  Instruction **local_78;
  iterator iStack_70;
  Instruction **local_68;
  ValidationState_t *local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  Instruction *local_40;
  _Alloc_node local_38;
  
  __position = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &__position->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &__position->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60 = this;
  local_40 = FindDef(this,id);
  if (local_40 != (Instruction *)0x0) {
    local_78 = (Instruction **)0x0;
    iStack_70._M_current = (Instruction **)0x0;
    local_68 = (Instruction **)0x0;
    std::vector<spvtools::val::Instruction_const*,std::allocator<spvtools::val::Instruction_const*>>
    ::_M_realloc_insert<spvtools::val::Instruction_const*const&>
              ((vector<spvtools::val::Instruction_const*,std::allocator<spvtools::val::Instruction_const*>>
                *)&local_78,(iterator)0x0,&local_40);
    if (local_78 != iStack_70._M_current) {
      do {
        pIVar3 = iStack_70._M_current[-1];
        iStack_70._M_current = iStack_70._M_current + -1;
        if (pIVar3->function_ == (Function *)0x0) {
          ppVar1 = (pIVar3->uses_).
                   super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (ppVar4 = (pIVar3->uses_).
                        super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppVar4 != ppVar1;
              ppVar4 = ppVar4 + 1) {
            local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)ppVar4->first;
            if (iStack_70._M_current == local_68) {
              std::
              vector<spvtools::val::Instruction_const*,std::allocator<spvtools::val::Instruction_const*>>
              ::_M_realloc_insert<spvtools::val::Instruction_const*const&>
                        ((vector<spvtools::val::Instruction_const*,std::allocator<spvtools::val::Instruction_const*>>
                          *)&local_78,iStack_70,(Instruction **)&local_58);
            }
            else {
              *iStack_70._M_current =
                   (Instruction *)
                   local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
              iStack_70._M_current = iStack_70._M_current + 1;
            }
          }
        }
        else {
          __x = FunctionEntryPoints(local_60,pIVar3->function_->id_);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_58,__x);
          puVar2 = local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          pIVar3 = (Instruction *)
                   local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_38._M_t = &__return_storage_ptr__->_M_t;
          for (; pIVar3 != (Instruction *)puVar2;
              pIVar3 = (Instruction *)
                       ((long)&(pIVar3->words_).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + 4)) {
            std::
            _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
            ::
            _M_insert_unique_<unsigned_int_const&,std::_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>::_Alloc_node>
                      ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                        *)__return_storage_ptr__,(const_iterator)__position,(uint *)pIVar3,&local_38
                      );
          }
          if ((Instruction *)
              local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (Instruction *)0x0) {
            operator_delete(local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_58.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_58.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
      } while (local_78 != iStack_70._M_current);
    }
    if (local_78 != (Instruction **)0x0) {
      operator_delete(local_78,(long)local_68 - (long)local_78);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<uint32_t> ValidationState_t::EntryPointReferences(uint32_t id) const {
  std::set<uint32_t> referenced_entry_points;
  const auto inst = FindDef(id);
  if (!inst) return referenced_entry_points;

  std::vector<const Instruction*> stack;
  stack.push_back(inst);
  while (!stack.empty()) {
    const auto current_inst = stack.back();
    stack.pop_back();

    if (const auto func = current_inst->function()) {
      // Instruction lives in a function, we can stop searching.
      const auto function_entry_points = FunctionEntryPoints(func->id());
      referenced_entry_points.insert(function_entry_points.begin(),
                                     function_entry_points.end());
    } else {
      // Instruction is in the global scope, keep searching its uses.
      for (auto pair : current_inst->uses()) {
        const auto next_inst = pair.first;
        stack.push_back(next_inst);
      }
    }
  }

  return referenced_entry_points;
}